

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  byte bVar1;
  GCObject *pGVar2;
  global_State *pgVar3;
  uint uVar4;
  TValue *pTVar5;
  CallInfo *pCVar6;
  StkId pTVar7;
  StkId pTVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  
  iVar11 = func->tt;
  if ((long)iVar11 != 6) {
    pTVar5 = luaT_gettmbyobj(L,func,TM_CALL);
    if (pTVar5->tt != 6) {
      luaG_runerror(L,"attempt to %s a %s value","call",luaT_typenames[iVar11]);
    }
    pTVar8 = L->stack;
    for (pTVar7 = L->top; func < pTVar7; pTVar7 = pTVar7 + -1) {
      pTVar7->value = pTVar7[-1].value;
      pTVar7->tt = pTVar7[-1].tt;
    }
    if ((long)L->stack_last - (long)L->top < 0x11) {
      luaD_growstack(L,1);
    }
    L->top = L->top + 1;
    lVar12 = (long)func - (long)pTVar8;
    pTVar7 = L->stack;
    *(Value *)((long)pTVar7 + lVar12) = pTVar5->value;
    *(int *)((long)pTVar7 + lVar12 + 8) = pTVar5->tt;
    func = (StkId)(lVar12 + (long)pTVar7);
  }
  pGVar2 = (func->value).gc;
  lVar12 = (long)func - (long)L->stack;
  L->ci->savedpc = L->savedpc;
  if ((pGVar2->h).flags == '\0') {
    pgVar3 = (pGVar2->th).l_G;
    iVar11 = (uint)*(byte *)((long)&pgVar3->GCthreshold + 1) +
             (uint)*(byte *)((long)&pgVar3->GCthreshold + 3);
    if ((long)L->stack_last - (long)L->top <= (long)(ulong)(uint)(iVar11 * 0x10)) {
      luaD_growstack(L,iVar11);
    }
    pTVar7 = (StkId)((long)L->stack + lVar12);
    if (*(char *)((long)&pgVar3->GCthreshold + 2) == '\0') {
      pTVar8 = pTVar7 + 1;
      if (pTVar7 + (ulong)*(byte *)((long)&pgVar3->GCthreshold + 1) + 1 < L->top) {
        L->top = pTVar7 + (ulong)*(byte *)((long)&pgVar3->GCthreshold + 1) + 1;
      }
    }
    else {
      pTVar8 = L->top;
      bVar1 = *(byte *)((long)&pgVar3->GCthreshold + 1);
      uVar4 = (uint)bVar1;
      iVar11 = (int)((ulong)((long)pTVar8 - (long)pTVar7) >> 4);
      if ((int)(uint)bVar1 < iVar11) {
        uVar9 = iVar11 - 1;
      }
      else {
        iVar11 = (uVar4 - iVar11) + 1;
        do {
          pTVar8->tt = 0;
          pTVar8 = pTVar8 + 1;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
        L->top = pTVar8;
        uVar9 = uVar4;
      }
      pTVar8 = L->top;
      if (uVar4 != 0) {
        lVar10 = 0;
        do {
          pTVar7 = L->top;
          L->top = pTVar7 + 1;
          pTVar7->value = *(Value *)((long)&pTVar8[-(ulong)uVar9].value + lVar10);
          pTVar7->tt = *(int *)((long)&pTVar8[-(ulong)uVar9].tt + lVar10);
          *(undefined4 *)((long)&pTVar8[-(ulong)uVar9].tt + lVar10) = 0;
          lVar10 = lVar10 + 0x10;
        } while ((ulong)bVar1 << 4 != lVar10);
      }
      pTVar7 = (StkId)(lVar12 + (long)L->stack);
    }
    if (L->ci == L->end_ci) {
      pCVar6 = growCI(L);
    }
    else {
      pCVar6 = L->ci + 1;
      L->ci = pCVar6;
    }
    pCVar6->func = pTVar7;
    pCVar6->base = pTVar8;
    L->base = pTVar8;
    pTVar8 = pTVar8 + *(byte *)((long)&pgVar3->GCthreshold + 3);
    pCVar6->top = pTVar8;
    L->savedpc = (Instruction *)pgVar3->ud;
    pCVar6->tailcalls = 0;
    pCVar6->nresults = nresults;
    for (pTVar7 = L->top; pTVar7 < pTVar8; pTVar7 = pTVar7 + 1) {
      pTVar7->tt = 0;
    }
    L->top = pTVar8;
    iVar11 = 0;
  }
  else {
    if ((long)L->stack_last - (long)L->top < 0x141) {
      luaD_growstack(L,0x14);
    }
    if (L->ci == L->end_ci) {
      pCVar6 = growCI(L);
    }
    else {
      pCVar6 = L->ci + 1;
      L->ci = pCVar6;
    }
    pTVar7 = L->stack;
    pCVar6->func = (StkId)((long)pTVar7 + lVar12);
    pTVar7 = (StkId)((long)pTVar7 + lVar12 + 0x10);
    pCVar6->base = pTVar7;
    L->base = pTVar7;
    pCVar6->top = L->top + 0x14;
    pCVar6->nresults = nresults;
    uVar4 = (*(code *)(((L->ci->func->value).gc)->h).node)(L);
    if ((int)uVar4 < 0) {
      iVar11 = 2;
    }
    else {
      luaD_poscall(L,L->top + -(ulong)uVar4);
      iVar11 = 1;
    }
  }
  return iVar11;
}

Assistant:

static int luaD_precall(lua_State*L,StkId func,int nresults){
LClosure*cl;
ptrdiff_t funcr;
if(!ttisfunction(func))
func=tryfuncTM(L,func);
funcr=savestack(L,func);
cl=&clvalue(func)->l;
L->ci->savedpc=L->savedpc;
if(!cl->isC){
CallInfo*ci;
StkId st,base;
Proto*p=cl->p;
luaD_checkstack(L,p->maxstacksize+p->numparams);
func=restorestack(L,funcr);
if(!p->is_vararg){
base=func+1;
if(L->top>base+p->numparams)
L->top=base+p->numparams;
}
else{
int nargs=cast_int(L->top-func)-1;
base=adjust_varargs(L,p,nargs);
func=restorestack(L,funcr);
}
ci=inc_ci(L);
ci->func=func;
L->base=ci->base=base;
ci->top=L->base+p->maxstacksize;
L->savedpc=p->code;
ci->tailcalls=0;
ci->nresults=nresults;
for(st=L->top;st<ci->top;st++)
setnilvalue(st);
L->top=ci->top;
return 0;
}
else{
CallInfo*ci;
int n;
luaD_checkstack(L,20);
ci=inc_ci(L);
ci->func=restorestack(L,funcr);
L->base=ci->base=ci->func+1;
ci->top=L->top+20;
ci->nresults=nresults;
n=(*curr_func(L)->c.f)(L);
if(n<0)
return 2;
else{
luaD_poscall(L,L->top-n);
return 1;
}
}
}